

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O2

void __thiscall EthUdpPort::~EthUdpPort(EthUdpPort *this)

{
  ~EthUdpPort(this);
  operator_delete(this,0x570);
  return;
}

Assistant:

EthUdpPort::~EthUdpPort()
{
    Cleanup();
    delete sockPtr;
}